

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_setup_build_prediction_by_above_pred
               (MACROBLOCKD *xd,int rel_mi_col,uint8_t above_mi_width,MB_MODE_INFO *above_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  char cVar1;
  MV_REFERENCE_FRAME ref_frame;
  undefined1 uVar2;
  AV1_COMMON *cm;
  macroblockd_plane *pmVar3;
  int iVar4;
  RefCntBuffer *pRVar5;
  scale_factors *sf;
  BLOCK_SIZE bsize;
  ulong uVar6;
  long lVar7;
  buf_2d *dst;
  
  uVar2 = above_mbmi->bsize;
  bsize = BLOCK_8X8;
  if (BLOCK_8X8 < (byte)uVar2) {
    bsize = uVar2;
  }
  iVar4 = xd->mi_col;
  above_mbmi->ref_frame[1] = -1;
  lVar7 = 0;
  uVar6 = 0;
  if (0 < num_planes) {
    uVar6 = (ulong)(uint)num_planes;
  }
  (above_mbmi->interinter_comp).type = '\0';
  pmVar3 = xd->plane;
  for (; dst = &pmVar3->dst, uVar6 * 4 != lVar7; lVar7 = lVar7 + 4) {
    setup_pred_plane(dst,bsize,*(uint8_t **)((long)ctxt->tmp_buf + lVar7 * 2),
                     *(int *)((long)ctxt->tmp_width + lVar7),
                     *(int *)((long)ctxt->tmp_height + lVar7),
                     *(int *)((long)ctxt->tmp_stride + lVar7),0,rel_mi_col,(scale_factors *)0x0,
                     *(int *)((long)(dst + -1) + 0x14),*(int *)((long)(dst + -1) + 0x18));
    pmVar3 = (macroblockd_plane *)(dst + 0x51);
  }
  iVar4 = iVar4 + rel_mi_col;
  cVar1 = above_mbmi->ref_frame[1];
  for (lVar7 = 0; (ulong)('\0' < cVar1) + 1 != lVar7; lVar7 = lVar7 + 1) {
    ref_frame = above_mbmi->ref_frame[lVar7];
    cm = ctxt->cm;
    pRVar5 = get_ref_frame_buf(cm,ref_frame);
    sf = get_ref_scale_factors_const(cm,ref_frame);
    xd->block_ref_scale_factors[lVar7] = sf;
    if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
      aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    }
    av1_setup_pre_planes(xd,(int)lVar7,&pRVar5->buf,xd->mi_row,iVar4,sf,num_planes);
  }
  xd->mb_to_left_edge = iVar4 * -0x20;
  xd->mb_to_right_edge =
       ((uint)xd->width - ((uint)above_mi_width + rel_mi_col)) * 0x20 + ctxt->mb_to_far_edge;
  return;
}

Assistant:

void av1_setup_build_prediction_by_above_pred(
    MACROBLOCKD *xd, int rel_mi_col, uint8_t above_mi_width,
    MB_MODE_INFO *above_mbmi, struct build_prediction_ctxt *ctxt,
    const int num_planes) {
  const BLOCK_SIZE a_bsize = AOMMAX(BLOCK_8X8, above_mbmi->bsize);
  const int above_mi_col = xd->mi_col + rel_mi_col;

  modify_neighbor_predictor_for_obmc(above_mbmi);

  for (int j = 0; j < num_planes; ++j) {
    struct macroblockd_plane *const pd = &xd->plane[j];
    setup_pred_plane(&pd->dst, a_bsize, ctxt->tmp_buf[j], ctxt->tmp_width[j],
                     ctxt->tmp_height[j], ctxt->tmp_stride[j], 0, rel_mi_col,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const int num_refs = 1 + has_second_ref(above_mbmi);

  for (int ref = 0; ref < num_refs; ++ref) {
    const MV_REFERENCE_FRAME frame = above_mbmi->ref_frame[ref];

    const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
    const struct scale_factors *const sf =
        get_ref_scale_factors_const(ctxt->cm, frame);
    xd->block_ref_scale_factors[ref] = sf;
    if ((!av1_is_valid_scale(sf)))
      aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    av1_setup_pre_planes(xd, ref, &ref_buf->buf, xd->mi_row, above_mi_col, sf,
                         num_planes);
  }

  xd->mb_to_left_edge = 8 * MI_SIZE * (-above_mi_col);
  xd->mb_to_right_edge =
      ctxt->mb_to_far_edge +
      (xd->width - rel_mi_col - above_mi_width) * MI_SIZE * 8;
}